

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex_ensure.h
# Opt level: O1

cellid_t __thiscall trimesh::mscomplex_t::vertid(mscomplex_t *this,int i)

{
  pointer piVar1;
  ostream *poVar2;
  runtime_error *this_00;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if ((-1 < i) &&
     (piVar1 = (this->m_cp_vertid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     i < (int)((ulong)((long)(this->m_cp_vertid).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2))) {
    return piVar1[(uint)i];
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Failed to assert condition ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"is_in_range(i,0,(int)m_cp_vertid.size())",0x28);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"at (",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex_ensure.h"
             ,0x6e);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"vertid",6);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,",",1);
  poVar2 = (ostream *)std::ostream::operator<<(local_190,0x44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") \n ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"i",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,i);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline cellid_t mscomplex_t::vertid(int i) const
{
  ASSERTV(is_in_range(i,0,(int)m_cp_vertid.size()),i);

  return m_cp_vertid[i];
}